

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O0

bool __thiscall
USBSignalFilter::SkipNoise
          (USBSignalFilter *this,AnalyzerChannelData *pNearer,AnalyzerChannelData *pFurther)

{
  ulong uVar1;
  U32 IGNORE_PULSE_SAMPLES;
  AnalyzerChannelData *pFurther_local;
  AnalyzerChannelData *pNearer_local;
  USBSignalFilter *this_local;
  
  if ((20.0 < this->mSampleDur) || (this->mSpeed == FULL_SPEED)) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)pNearer);
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      AnalyzerChannelData::AdvanceToNextEdge();
      AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pFurther);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool USBSignalFilter::SkipNoise( AnalyzerChannelData* pNearer, AnalyzerChannelData* pFurther )
{
    if( mSampleDur > 20 // sample rate < 50Mhz?
        || mSpeed == FULL_SPEED )
        return false;

    // up to 20ns
    const U32 IGNORE_PULSE_SAMPLES = mSampleDur == 10 ? 2 : 1;

    // skip the glitch
    if( pNearer->WouldAdvancingCauseTransition( IGNORE_PULSE_SAMPLES ) )
    {
        pNearer->AdvanceToNextEdge();
        pFurther->AdvanceToAbsPosition( pNearer->GetSampleNumber() );

        return true;
    }

    return false;
}